

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::Data
          (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *this,
          Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *other,size_t reserved)

{
  QByteArray *key;
  ulong uVar1;
  Span *pSVar2;
  Data *pDVar3;
  ulong uVar4;
  Node<QByteArray,_QHashDummyValue> *pNVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  QByteArrayView QVar10;
  R RVar11;
  Bucket BVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  sVar8 = 0x80;
  if ((0x40 < reserved) && (sVar8 = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = sVar8;
  RVar11 = allocateSpans(sVar8);
  this->spans = (Span *)RVar11.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pSVar2 = other->spans;
      lVar9 = 0;
      do {
        uVar4 = (ulong)pSVar2->offsets[lVar9 + lVar6];
        if (uVar4 != 0xff) {
          key = (QByteArray *)(pSVar2[uVar7].entries + uVar4);
          QVar10.m_data = (key->d).ptr;
          QVar10.m_size = (key->d).size;
          sVar8 = qHash(QVar10,this->seed);
          BVar12 = findBucketWithHash<QByteArray>(this,key,sVar8);
          pNVar5 = Span<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::insert
                             (BVar12.span,BVar12.index);
          pDVar3 = (key->d).d;
          (pNVar5->key).d.d = pDVar3;
          (pNVar5->key).d.ptr = (key->d).ptr;
          (pNVar5->key).d.size = (key->d).size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar7 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }